

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void object_suite::fail_missing_begin_after_comma(void)

{
  view_type local_200;
  view_type local_1e8;
  undefined4 local_1d4;
  size_type local_1d0 [2];
  undefined4 local_1c0;
  value local_1bc;
  undefined1 local_1b7;
  undefined1 local_1b6 [2];
  undefined4 local_1b4;
  size_type local_1b0 [2];
  undefined4 local_1a0;
  value local_19c;
  undefined1 local_197;
  undefined1 local_196 [2];
  undefined4 local_194;
  size_type local_190 [3];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [5];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x7d2c7d7b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3c8,"void object_suite::fail_missing_begin_after_comma()",local_170,&local_174);
  local_190[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_194 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3c9,"void object_suite::fail_missing_begin_after_comma()",local_190,&local_194);
  local_196[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_197 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3ca,"void object_suite::fail_missing_begin_after_comma()",local_196,&local_197);
  local_19c = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1a0 = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3cb,"void object_suite::fail_missing_begin_after_comma()",&local_19c,&local_1a0);
  local_1b0[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_1b4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3cc,"void object_suite::fail_missing_begin_after_comma()",local_1b0,&local_1b4);
  local_1b6[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1b7 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3cd,"void object_suite::fail_missing_begin_after_comma()",local_1b6,&local_1b7);
  local_1bc = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1c0 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_value_separator",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3ce,"void object_suite::fail_missing_begin_after_comma()",&local_1bc,&local_1c0);
  local_1d0[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_1d4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3cf,"void object_suite::fail_missing_begin_after_comma()",local_1d0,&local_1d4);
  local_1e8 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\",\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3d0,"void object_suite::fail_missing_begin_after_comma()",&local_1e8,",");
  local_200 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.tail()","\"}\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3d1,"void object_suite::fail_missing_begin_after_comma()",&local_200,"}");
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void fail_missing_begin_after_comma()
{
    const char input[] = "{},}";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_value_separator);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), ",");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "}");
}